

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O1

void __thiscall Dice::rollAggressiveComputer(Dice *this)

{
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  *this_00;
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  *pmVar1;
  int iVar2;
  mapped_type *pmVar3;
  int iVar4;
  DiceOptions value_1;
  DiceOptions value;
  key_type local_78 [4];
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  *local_68;
  _Rb_tree<Dice::DiceOptions,_std::pair<const_Dice::DiceOptions,_int>,_std::_Select1st<std::pair<const_Dice::DiceOptions,_int>_>,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  local_60;
  
  this_00 = &this->DiceValues;
  iVar4 = 6;
  do {
    iVar2 = rand();
    local_78[3] = iVar2 % 6;
    pmVar3 = std::
             map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
             ::operator[](this_00,local_78 + 3);
    *pmVar3 = *pmVar3 + 1;
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  local_78[0] = Attack;
  pmVar3 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](this_00,local_78);
  iVar4 = *pmVar3;
  pmVar1 = &this->resolvedHand;
  local_78[1] = 1;
  pmVar3 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](pmVar1,local_78 + 1);
  *pmVar3 = *pmVar3 + iVar4;
  local_78[0] = Destruction;
  pmVar3 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](this_00,local_78);
  iVar4 = *pmVar3;
  local_78[1] = 2;
  local_68 = pmVar1;
  pmVar3 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](pmVar1,local_78 + 1);
  *pmVar3 = *pmVar3 + iVar4;
  resetDiceValuesMap(this);
  iVar4 = addToCount(this);
  if (iVar4 < 6) {
    iVar4 = addToCount(this);
    if (iVar4 < 6) {
      iVar4 = 0;
      do {
        iVar2 = rand();
        local_78[0] = iVar2 % 6;
        pmVar3 = std::
                 map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
                 ::operator[](this_00,local_78);
        *pmVar3 = *pmVar3 + 1;
        iVar4 = iVar4 + 1;
        iVar2 = addToCount(this);
      } while (iVar4 < 6 - iVar2);
    }
    local_78[1] = 1;
    pmVar3 = std::
             map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
             ::operator[](this_00,local_78 + 1);
    pmVar1 = local_68;
    iVar4 = *pmVar3;
    local_78[2] = 1;
    pmVar3 = std::
             map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
             ::operator[](local_68,local_78 + 2);
    *pmVar3 = *pmVar3 + iVar4;
    local_78[1] = 2;
    pmVar3 = std::
             map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
             ::operator[](this_00,local_78 + 1);
    iVar4 = *pmVar3;
    local_78[2] = 2;
    pmVar3 = std::
             map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
             ::operator[](pmVar1,local_78 + 2);
    *pmVar3 = *pmVar3 + iVar4;
    resetDiceValuesMap(this);
  }
  iVar4 = addToCount(this);
  if (iVar4 < 6) {
    iVar4 = addToCount(this);
    if (iVar4 < 6) {
      iVar4 = 0;
      do {
        iVar2 = rand();
        local_78[0] = iVar2 % 6;
        pmVar3 = std::
                 map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
                 ::operator[](this_00,local_78);
        *pmVar3 = *pmVar3 + 1;
        iVar4 = iVar4 + 1;
        iVar2 = addToCount(this);
      } while (iVar4 < 6 - iVar2);
    }
  }
  addDiceValuesToResolvedHand(this);
  std::
  _Rb_tree<Dice::DiceOptions,_std::pair<const_Dice::DiceOptions,_int>,_std::_Select1st<std::pair<const_Dice::DiceOptions,_int>_>,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  ::_Rb_tree(&local_60,&local_68->_M_t);
  std::
  vector<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
  ::push_back(&this->historyOfResolvedRolls,(value_type *)&local_60);
  std::
  _Rb_tree<Dice::DiceOptions,_std::pair<const_Dice::DiceOptions,_int>,_std::_Select1st<std::pair<const_Dice::DiceOptions,_int>_>,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  ::~_Rb_tree(&local_60);
  resetResolvedHand(this);
  resetDiceValuesMap(this);
  return;
}

Assistant:

void Dice::rollAggressiveComputer(){

    DiceOptions value;
    for(int i=0; i<6; i++)
    {
        value = randomDiceOption();
        this->DiceValues[value] ++;
    }

    this->resolvedHand[Attack] += this->DiceValues[Attack];
    this->resolvedHand[Destruction] += this->DiceValues[Destruction];

    resetDiceValuesMap();

    if(addToCount() <6){
        DiceOptions value;
        for(int i=0; i<6-addToCount(); i++)
        {
            value = randomDiceOption();
            this->DiceValues[value] ++;
        }

        this->resolvedHand[Attack] += this->DiceValues[Attack];
        this->resolvedHand[Destruction] += this->DiceValues[Destruction];
        resetDiceValuesMap();
    }

    if(addToCount() < 6){
        DiceOptions value;
        for(int i=0; i<6-addToCount(); i++)
        {
            value = randomDiceOption();
            this->DiceValues[value] ++;
        }
    }

    addDiceValuesToResolvedHand();
    storeResolvedHand(resolvedHand);

    resetResolvedHand();
    resetDiceValuesMap();

}